

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-opcodecnt.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  bool bVar1;
  Enum EVar2;
  uchar *data;
  size_type_conflict size;
  size_t sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view filename;
  char *local_f0;
  undefined1 local_e0 [8];
  OpcodeInfoCounts counts;
  string_view local_a8;
  undefined1 local_98 [8];
  FileStream stream;
  char *input_name;
  string_view local_48;
  Result local_34;
  undefined1 local_30 [4];
  Result result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  char **argv_local;
  int argc_local;
  
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  wabt::string_view::string_view(&local_48,s_infile);
  filename.size_ = (size_type)local_30;
  filename.data_ = (char *)local_48.size_;
  local_34 = wabt::ReadFile((wabt *)local_48.data_,filename,in_RCX);
  bVar1 = wabt::Failed(local_34);
  if (bVar1) {
    if (s_infile == (char *)0x0) {
      local_f0 = "stdin";
    }
    else {
      local_f0 = s_infile;
    }
    fprintf(_stderr,"%s:%d: Unable to parse: %s",
            "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-opcodecnt.cc"
            ,0x9f,local_f0);
    argv_local._4_4_ = 1;
    stream._52_4_ = 1;
  }
  else {
    if (s_outfile == (char *)0x0) {
      wabt::FileStream::FileStream((FileStream *)local_98,_stdout,(Stream *)0x0);
    }
    else {
      wabt::string_view::string_view(&local_a8,s_outfile);
      wabt::FileStream::FileStream((FileStream *)local_98,local_a8,(Stream *)0x0);
    }
    counts._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = local_34.enum_;
    bVar1 = wabt::Succeeded(local_34);
    if (bVar1) {
      std::
      map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
      ::map((map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
             *)local_e0);
      s_read_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
      s_read_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      s_read_binary_options.features.sat_float_to_int_enabled_ =
           s_features.sat_float_to_int_enabled_;
      s_read_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
      s_read_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
      s_read_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
      s_read_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
      s_read_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
      s_read_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
      s_read_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
      s_read_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
      s_read_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
      data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      local_34 = wabt::ReadBinaryOpcnt
                           (data,size,&s_read_binary_options,(OpcodeInfoCounts *)local_e0);
      bVar1 = wabt::Succeeded(local_34);
      if (bVar1) {
        sVar3 = SumCounts((OpcodeInfoCounts *)local_e0);
        wabt::Stream::Writef((Stream *)local_98,"Total opcodes: %zd\n\n",sVar3);
        wabt::Stream::Writef((Stream *)local_98,"Opcode counts:\n");
        WriteCounts((Stream *)local_98,(OpcodeInfoCounts *)local_e0);
        wabt::Stream::Writef((Stream *)local_98,"\nOpcode counts with immediates:\n");
        WriteCountsWithImmediates((Stream *)local_98,(OpcodeInfoCounts *)local_e0);
      }
      std::
      map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
      ::~map((map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
              *)local_e0);
    }
    EVar2 = wabt::Result::operator_cast_to_Enum(&local_34);
    argv_local._4_4_ = (uint)(EVar2 != Ok);
    stream._52_4_ = 1;
    wabt::FileStream::~FileStream((FileStream *)local_98);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return argv_local._4_4_;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  if (Failed(result)) {
    const char* input_name = s_infile ? s_infile : "stdin";
    ERROR("Unable to parse: %s", input_name);
    return 1;
  }

  FileStream stream(s_outfile ? FileStream(s_outfile) : FileStream(stdout));

  if (Succeeded(result)) {
    OpcodeInfoCounts counts;
    s_read_binary_options.features = s_features;
    result = ReadBinaryOpcnt(file_data.data(), file_data.size(),
                             s_read_binary_options, &counts);
    if (Succeeded(result)) {
      stream.Writef("Total opcodes: %" PRIzd "\n\n", SumCounts(counts));

      stream.Writef("Opcode counts:\n");
      WriteCounts(stream, counts);

      stream.Writef("\nOpcode counts with immediates:\n");
      WriteCountsWithImmediates(stream, counts);
    }
  }

  return result != Result::Ok;
}